

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validator.cpp
# Opt level: O3

void __thiscall
arangodb::velocypack::Validator::validateIndexedObject(Validator *this,uint8_t *ptr,size_t length)

{
  byte bVar1;
  uint uVar2;
  byte bVar3;
  pointer __p;
  undefined1 *puVar4;
  int64_t iVar5;
  ValueLength length_00;
  ulong uVar6;
  iterator __it;
  Exception *pEVar7;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *puVar8;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *puVar9;
  char *msg;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ulong *puVar13;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *puVar14;
  ulong uVar15;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *ptr_00;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *puVar16;
  long lVar17;
  bool bVar18;
  unique_ptr<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::default_delete<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  offsetSet;
  Slice key;
  ValueLength offset;
  ValueLength tableBuf [16];
  undefined1 *local_108;
  _Head_base<0UL,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_*,_false>
  local_f8;
  ulong local_f0;
  _Head_base<0UL,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_*,_false>
  local_e8;
  long local_e0;
  ulong local_d8;
  Validator *local_d0;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *local_c8;
  long local_c0;
  undefined1 local_b8 [136];
  
  bVar1 = *ptr;
  lVar12 = ((ulong)((ulong)bVar1 < 0xf) << 2 | 0xfffffffffffffff1) + (ulong)bVar1;
  bVar3 = (byte)lVar12;
  lVar17 = 1L << (bVar3 & 0x3f);
  local_d0 = this;
  validateBufferLength(this,(2L << (bVar3 & 0x3f)) + 2,length,true);
  puVar13 = (ulong *)(ptr + 1);
  local_d8 = lVar17 - 1;
  local_e0 = lVar12;
  switch(local_d8) {
  case 0:
    uVar15 = (ulong)(byte)*puVar13;
    break;
  case 1:
    uVar15 = (ulong)(ushort)*puVar13;
    break;
  case 2:
    uVar6 = (ulong)ptr[1];
    uVar15 = (ulong)*(ushort *)(ptr + 2) << 8;
    goto LAB_00115193;
  case 3:
    uVar15 = (ulong)*(uint *)(ptr + 1);
    break;
  case 4:
    uVar2 = (uint)*puVar13;
    uVar15 = (ulong)ptr[5];
    goto LAB_0011518f;
  case 5:
    uVar2 = (uint)*puVar13;
    uVar15 = (ulong)*(ushort *)(ptr + 5);
LAB_0011518f:
    uVar6 = (ulong)uVar2;
    uVar15 = uVar15 << 0x20;
LAB_00115193:
    uVar15 = uVar15 | uVar6;
    break;
  case 6:
    uVar15 = (ulong)(uint7)*puVar13;
    break;
  case 7:
    uVar15 = *puVar13;
    break;
  default:
    uVar15 = 0;
    goto LAB_001151bd;
  }
  if (length < uVar15) {
    pEVar7 = (Exception *)__cxa_allocate_exception(0x18);
    msg = "Object length is out of bounds";
    goto LAB_0011591f;
  }
LAB_001151bd:
  if ((bVar1 != 0x12) && (bVar1 != 0xe)) {
    if (7 < local_d8) goto LAB_001158a8;
    puVar13 = (ulong *)((long)puVar13 + lVar17);
    switch(local_d8) {
    case 0:
      uVar6 = (ulong)(byte)*puVar13;
      break;
    case 1:
      uVar6 = (ulong)(ushort)*puVar13;
      break;
    case 2:
      uVar11 = (ulong)(byte)*puVar13;
      uVar6 = (ulong)*(ushort *)((long)puVar13 + 1) << 8;
      goto LAB_001152ea;
    case 3:
      uVar6 = (ulong)(uint)*puVar13;
      break;
    case 4:
      uVar2 = (uint)*puVar13;
      uVar6 = (ulong)*(byte *)((long)puVar13 + 4);
      goto LAB_001152e6;
    case 5:
      uVar2 = (uint)*puVar13;
      uVar6 = (ulong)*(ushort *)((long)puVar13 + 4);
LAB_001152e6:
      uVar11 = (ulong)uVar2;
      uVar6 = uVar6 << 0x20;
LAB_001152ea:
      uVar6 = uVar6 | uVar11;
      break;
    case 6:
      uVar6 = (ulong)(uint7)*puVar13;
      break;
    case 7:
      uVar6 = *puVar13;
    }
    if (uVar6 == 0) goto LAB_001158a8;
    ptr_00 = (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
              *)((long)puVar13 + lVar17);
    puVar8 = (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
              *)((long)&(ptr_00->_M_h)._M_bucket_count + (-2L << (bVar3 & 0x3f)));
    puVar14 = (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
               *)(ptr + uVar15);
    puVar9 = puVar8;
    if (puVar14 < puVar8) {
      puVar9 = puVar14;
    }
    puVar16 = ptr_00;
    if (ptr_00 < puVar9) {
      do {
        if (*(byte *)&(puVar16->_M_h)._M_buckets != 0) break;
        puVar16 = (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)((long)&(puVar16->_M_h)._M_buckets + 1);
      } while (puVar16 < puVar9);
      bVar18 = puVar16 != ptr_00;
      ptr_00 = puVar16;
      if ((bVar18) && (puVar16 != puVar8)) {
        pEVar7 = (Exception *)__cxa_allocate_exception(0x18);
        msg = "Object padding is invalid";
        goto LAB_0011591f;
      }
    }
    puVar14 = (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
               *)((long)puVar14 - (uVar6 << (bVar3 & 0x3f)));
    if (((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          *)(ptr + lVar17 * 2) <= puVar14) && (ptr_00 <= puVar14)) {
      lVar17 = -lVar17;
      goto LAB_001153aa;
    }
    goto LAB_001158be;
  }
  if (7 < local_d8) goto LAB_001158a8;
  ptr_00 = (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
            *)(ptr + uVar15);
  puVar13 = (ulong *)((long)ptr_00 - lVar17);
  switch(local_d8) {
  case 0:
    uVar6 = (ulong)(byte)*puVar13;
    break;
  case 1:
    uVar6 = (ulong)(ushort)*puVar13;
    break;
  case 2:
    uVar15 = (ulong)(byte)*puVar13;
    uVar6 = (ulong)*(ushort *)((long)puVar13 + 1) << 8;
    goto LAB_00115262;
  case 3:
    uVar6 = (ulong)(uint)*puVar13;
    break;
  case 4:
    uVar2 = (uint)*puVar13;
    uVar6 = (ulong)*(byte *)((long)puVar13 + 4);
    goto LAB_0011525e;
  case 5:
    uVar2 = (uint)*puVar13;
    uVar6 = (ulong)*(ushort *)((long)puVar13 + 4);
LAB_0011525e:
    uVar15 = (ulong)uVar2;
    uVar6 = uVar6 << 0x20;
LAB_00115262:
    uVar6 = uVar6 | uVar15;
    break;
  case 6:
    uVar6 = (ulong)(uint7)*puVar13;
    break;
  case 7:
    uVar6 = *puVar13;
  }
  if (uVar6 == 0) {
LAB_001158a8:
    pEVar7 = (Exception *)__cxa_allocate_exception(0x18);
    msg = "Object nrItems value is invalid";
  }
  else {
    puVar14 = (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
               *)((long)puVar13 - (uVar6 << (bVar3 & 0x3f)));
    if ((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
         *)(ptr + lVar17) <= puVar14) {
      lVar17 = lVar17 * -2;
LAB_001153aa:
      if (puVar14 <=
          (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
           *)(ptr + lVar17 + length)) {
        local_f8._M_head_impl =
             (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
              *)0x0;
        puVar4 = local_b8;
        if (0x10 < uVar6) {
          if (uVar6 < 0x81) {
            puVar4 = (undefined1 *)operator_new__(uVar6 * 8);
            local_108 = puVar4;
            goto LAB_00115436;
          }
          local_f8._M_head_impl =
               (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                *)operator_new(0x38);
          *(undefined8 *)
           &((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              *)local_f8._M_head_impl)->_M_rehash_policy = 0;
          (((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             *)local_f8._M_head_impl)->_M_rehash_policy)._M_next_resize = 0;
          ((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            *)local_f8._M_head_impl)->_M_buckets =
               &((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)local_f8._M_head_impl)->_M_single_bucket;
          ((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            *)local_f8._M_head_impl)->_M_bucket_count = 1;
          (((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             *)local_f8._M_head_impl)->_M_before_begin)._M_nxt = (_Hash_node_base *)0x0;
          ((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            *)local_f8._M_head_impl)->_M_element_count = 0;
          (((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             *)local_f8._M_head_impl)->_M_rehash_policy)._M_max_load_factor = 1.0;
          (((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             *)local_f8._M_head_impl)->_M_rehash_policy)._M_next_resize = 0;
          ((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            *)local_f8._M_head_impl)->_M_single_bucket = (__node_base_ptr)0x0;
          local_e8._M_head_impl =
               (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                *)0x0;
          std::
          unique_ptr<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::default_delete<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
          ::~unique_ptr((unique_ptr<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::default_delete<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                         *)&local_e8);
        }
        local_108 = (undefined1 *)0x0;
LAB_00115436:
        uVar15 = 0;
        local_f0 = uVar6;
        for (; ptr_00 < puVar14;
            ptr_00 = (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                      *)((long)&(ptr_00->_M_h)._M_buckets + uVar6 + length_00)) {
          validatePart(local_d0,(uint8_t *)ptr_00,(long)puVar14 - (long)ptr_00,true);
          bVar1 = *(byte *)&(ptr_00->_M_h)._M_buckets;
          uVar11 = (ulong)bVar1;
          uVar6 = uVar11 - 0x40;
          local_e8._M_head_impl = ptr_00;
          if (0x7f < uVar6) {
            if ((bVar1 & 0xf0) == 0x30) {
              iVar5 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
                      getSmallInt((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
                                   *)&local_e8);
              if (iVar5 < 1) {
LAB_0011586f:
                pEVar7 = (Exception *)__cxa_allocate_exception(0x18);
                Exception::Exception(pEVar7,ValidatorInvalidLength,"Invalid object key type");
                __cxa_throw(pEVar7,&Exception::typeinfo,Exception::~Exception);
              }
              uVar11 = (ulong)*(byte *)&((local_e8._M_head_impl)->_M_h)._M_buckets;
            }
            else if ((bVar1 & 0xf8) != 0x28) goto LAB_0011586f;
          }
          length_00 = (ValueLength)"\x01\x01"[uVar11];
          if (length_00 == 0) {
            length_00 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
                        byteSizeDynamic((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
                                         *)&local_e8,(uint8_t *)local_e8._M_head_impl);
          }
          if ((uVar6 < 0x80) && (local_d0->options->validateUtf8Strings == true)) {
            validatePart(local_d0,(uint8_t *)ptr_00,length_00,true);
          }
          puVar9 = (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                    *)((long)&(ptr_00->_M_h)._M_buckets + length_00);
          if (puVar14 <= puVar9) {
            pEVar7 = (Exception *)__cxa_allocate_exception(0x18);
            Exception::Exception
                      (pEVar7,ValidatorInvalidLength,"Object value leaking into index table");
            __cxa_throw(pEVar7,&Exception::typeinfo,Exception::~Exception);
          }
          validatePart(local_d0,(uint8_t *)puVar9,(long)puVar14 - (long)puVar9,true);
          local_c0 = (long)ptr_00 - (long)ptr;
          if (local_f0 < 0x81) {
            *(long *)(puVar4 + uVar15 * 8) = local_c0;
          }
          else {
            std::
            _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::_M_emplace<unsigned_long&>
                      ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)local_f8._M_head_impl,&local_c0);
          }
          uVar6 = (ulong)"\x01\x01"[*(byte *)&(puVar9->_M_h)._M_buckets];
          local_c8 = puVar9;
          if (uVar6 == 0) {
            uVar6 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
                    byteSizeDynamic((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
                                     *)&local_c8,(uint8_t *)puVar9);
          }
          uVar15 = uVar15 + 1;
          if (local_f0 < uVar15) {
            pEVar7 = (Exception *)__cxa_allocate_exception(0x18);
            Exception::Exception
                      (pEVar7,ValidatorInvalidLength,
                       "Object value has more key/value pairs than announced");
            __cxa_throw(pEVar7,&Exception::typeinfo,Exception::~Exception);
          }
        }
        if (uVar15 < local_f0) {
          pEVar7 = (Exception *)__cxa_allocate_exception(0x18);
          Exception::Exception(pEVar7,ValidatorInvalidLength,"Object has fewer items than in index")
          ;
          __cxa_throw(pEVar7,&Exception::typeinfo,Exception::~Exception);
        }
        bVar1 = (byte)local_e0;
        if (local_f0 < 0x81) {
          lVar17 = 0;
          do {
            lVar12 = lVar17 << (bVar1 & 0x3f);
            switch(local_d8) {
            case 0:
              uVar15 = (ulong)*(byte *)((long)&(puVar14->_M_h)._M_buckets + lVar12);
              break;
            case 1:
              uVar15 = (ulong)*(ushort *)((long)&(puVar14->_M_h)._M_buckets + lVar12);
              break;
            case 2:
              uVar6 = (ulong)*(byte *)((long)&(puVar14->_M_h)._M_buckets + lVar12);
              uVar15 = (ulong)*(ushort *)((long)&(puVar14->_M_h)._M_buckets + lVar12 + 1) << 8;
              goto LAB_00115641;
            case 3:
              uVar15 = (ulong)*(uint *)((long)&(puVar14->_M_h)._M_buckets + lVar12);
              break;
            case 4:
              uVar2 = *(uint *)((long)&(puVar14->_M_h)._M_buckets + lVar12);
              uVar15 = (ulong)*(byte *)((long)&(puVar14->_M_h)._M_buckets + lVar12 + 4);
              goto LAB_00115620;
            case 5:
              uVar2 = *(uint *)((long)&(puVar14->_M_h)._M_buckets + lVar12);
              uVar15 = (ulong)*(ushort *)((long)&(puVar14->_M_h)._M_buckets + lVar12 + 4);
LAB_00115620:
              uVar6 = (ulong)uVar2;
              uVar15 = uVar15 << 0x20;
              goto LAB_00115641;
            case 6:
              uVar6 = (ulong)CONCAT12(*(byte *)((long)&(puVar14->_M_h)._M_buckets + lVar12 + 6),
                                      *(undefined2 *)
                                       ((long)&(puVar14->_M_h)._M_buckets + lVar12 + 4)) << 0x20;
              uVar15 = (ulong)*(uint *)((long)&(puVar14->_M_h)._M_buckets + lVar12);
LAB_00115641:
              uVar15 = uVar15 | uVar6;
              break;
            case 7:
              uVar15 = *(ulong *)((long)&(puVar14->_M_h)._M_buckets + lVar12);
              break;
            default:
              uVar15 = 0;
            }
            uVar11 = 0;
            uVar6 = local_f0;
            while( true ) {
              uVar10 = uVar6 + uVar11 >> 1;
              if (uVar15 == *(ulong *)(puVar4 + uVar10 * 8)) break;
              if (*(ulong *)(puVar4 + uVar10 * 8) <= uVar15) {
                uVar11 = uVar10 + 1;
                uVar10 = uVar6;
              }
              uVar6 = uVar10;
              if (uVar10 <= uVar11) {
                pEVar7 = (Exception *)__cxa_allocate_exception(0x18);
                Exception::Exception
                          (pEVar7,ValidatorInvalidLength,"Object has invalid index offset");
                __cxa_throw(pEVar7,&Exception::typeinfo,Exception::~Exception);
              }
            }
            lVar17 = lVar17 + 1;
          } while (lVar17 != local_f0 + (local_f0 == 0));
        }
        else {
          uVar15 = 0;
          do {
            lVar17 = uVar15 << (bVar1 & 0x3f);
            switch(local_d8) {
            case 0:
              local_e8._M_head_impl =
                   (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                    *)(ulong)*(byte *)((long)&(puVar14->_M_h)._M_buckets + lVar17);
              break;
            case 1:
              local_e8._M_head_impl =
                   (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                    *)(ulong)*(ushort *)((long)&(puVar14->_M_h)._M_buckets + lVar17);
              break;
            case 2:
              uVar11 = (ulong)*(byte *)((long)&(puVar14->_M_h)._M_buckets + lVar17);
              uVar6 = (ulong)*(ushort *)((long)&(puVar14->_M_h)._M_buckets + lVar17 + 1) << 8;
              goto LAB_001156fa;
            case 3:
              local_e8._M_head_impl =
                   (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                    *)(ulong)*(uint *)((long)&(puVar14->_M_h)._M_buckets + lVar17);
              break;
            case 4:
              uVar2 = *(uint *)((long)&(puVar14->_M_h)._M_buckets + lVar17);
              uVar6 = (ulong)*(byte *)((long)&(puVar14->_M_h)._M_buckets + lVar17 + 4);
              goto LAB_001156f6;
            case 5:
              uVar2 = *(uint *)((long)&(puVar14->_M_h)._M_buckets + lVar17);
              uVar6 = (ulong)*(ushort *)((long)&(puVar14->_M_h)._M_buckets + lVar17 + 4);
LAB_001156f6:
              uVar11 = (ulong)uVar2;
              uVar6 = uVar6 << 0x20;
LAB_001156fa:
              local_e8._M_head_impl =
                   (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                    *)(uVar6 | uVar11);
              break;
            case 6:
              local_e8._M_head_impl =
                   (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                    *)(ulong)CONCAT34(CONCAT12(*(byte *)((long)&(puVar14->_M_h)._M_buckets +
                                                        lVar17 + 6),
                                               *(undefined2 *)
                                                ((long)&(puVar14->_M_h)._M_buckets + lVar17 + 4)),
                                      *(undefined4 *)((long)&(puVar14->_M_h)._M_buckets + lVar17));
              break;
            case 7:
              local_e8._M_head_impl =
                   *(unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                     **)((long)&(puVar14->_M_h)._M_buckets + lVar17);
              break;
            default:
              local_e8._M_head_impl =
                   (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                    *)0x0;
            }
            __it = std::
                   _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   ::find(&(local_f8._M_head_impl)->_M_h,(key_type *)&local_e8);
            if (__it.super__Node_iterator_base<unsigned_long,_false>._M_cur == (__node_type *)0x0) {
              pEVar7 = (Exception *)__cxa_allocate_exception(0x18);
              Exception::Exception(pEVar7,ValidatorInvalidLength,"Object has invalid index offset");
              __cxa_throw(pEVar7,&Exception::typeinfo,Exception::~Exception);
            }
            std::
            _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::erase(&(local_f8._M_head_impl)->_M_h,
                    (const_iterator)__it.super__Node_iterator_base<unsigned_long,_false>._M_cur);
            uVar15 = uVar15 + 1;
          } while (local_f0 != uVar15);
        }
        std::
        unique_ptr<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::default_delete<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
        ::~unique_ptr((unique_ptr<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::default_delete<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                       *)&local_f8);
        if (local_108 != (undefined1 *)0x0) {
          operator_delete__(local_108);
        }
        return;
      }
    }
LAB_001158be:
    pEVar7 = (Exception *)__cxa_allocate_exception(0x18);
    msg = "Object index table is out of bounds";
  }
LAB_0011591f:
  Exception::Exception(pEVar7,ValidatorInvalidLength,msg);
  __cxa_throw(pEVar7,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void Validator::validateIndexedObject(uint8_t const* ptr, std::size_t length) {
  // Object with index table, with 1-8 bytes lengths
  uint8_t head = *ptr;
  ValueLength byteSizeLength;
  if (VELOCYPACK_UNLIKELY(head >= 0x0f)) {
    byteSizeLength = 1ULL << (static_cast<ValueLength>(head) - 0x0fU);
  } else {
    byteSizeLength = 1ULL << (static_cast<ValueLength>(head) - 0x0bU);
  }
  VELOCYPACK_ASSERT(byteSizeLength > 0);
  validateBufferLength(1 + byteSizeLength + byteSizeLength + 1, length, true);
  ValueLength const byteSize =
      readIntegerNonEmpty<ValueLength>(ptr + 1, byteSizeLength);

  if (byteSize > length) {
    throw Exception(Exception::ValidatorInvalidLength,
                    "Object length is out of bounds");
  }

  ValueLength nrItems;
  uint8_t const* indexTable;
  uint8_t const* firstMember;

  if (head == 0x0eU || head == 0x12U) {
    // byte length = 8
    nrItems = readIntegerNonEmpty<ValueLength>(ptr + byteSize - byteSizeLength,
                                               byteSizeLength);

    if (nrItems == 0) {
      throw Exception(Exception::ValidatorInvalidLength,
                      "Object nrItems value is invalid");
    }

    indexTable = ptr + byteSize - byteSizeLength - (nrItems * byteSizeLength);
    if (indexTable < ptr + byteSizeLength ||
        indexTable > ptr + length - byteSizeLength - byteSizeLength) {
      throw Exception(Exception::ValidatorInvalidLength,
                      "Object index table is out of bounds");
    }

    firstMember = ptr + byteSize;
  } else {
    // byte length = 1, 2 or 4
    nrItems = readIntegerNonEmpty<ValueLength>(ptr + 1 + byteSizeLength,
                                               byteSizeLength);

    if (nrItems == 0) {
      throw Exception(Exception::ValidatorInvalidLength,
                      "Object nrItems value is invalid");
    }

    // look up first member
    uint8_t const* p = ptr + 1 + byteSizeLength + byteSizeLength;
    uint8_t const* e = p + (8 - byteSizeLength - byteSizeLength);
    if (e > ptr + byteSize) {
      e = ptr + byteSize;
    }
    while (p < e && *p == '\x00') {
      ++p;
    }

    // check if padding is correct
    if (p != ptr + 1 + byteSizeLength + byteSizeLength &&
        p != ptr + 1 + byteSizeLength + byteSizeLength +
                 (8 - byteSizeLength - byteSizeLength)) {
      throw Exception(Exception::ValidatorInvalidLength,
                      "Object padding is invalid");
    }

    indexTable = ptr + byteSize - (nrItems * byteSizeLength);
    if (indexTable < ptr + byteSizeLength + byteSizeLength || indexTable < p ||
        indexTable > ptr + length - byteSizeLength) {
      throw Exception(Exception::ValidatorInvalidLength,
                      "Object index table is out of bounds");
    }

    firstMember = p;
  }

  VELOCYPACK_ASSERT(nrItems > 0);

  ValueLength tableBuf[16];  // Fixed space to save offsets found sequentially
  ValueLength* table = tableBuf;
  std::unique_ptr<ValueLength[]> tableGuard;
  std::unique_ptr<std::unordered_set<ValueLength>> offsetSet;
  if (nrItems > 16) {
    if (nrItems <= 128) {
      table = new ValueLength[nrItems];  // throws if bad_alloc
      tableGuard.reset(table);           // for automatic deletion
    } else {
      // if we have even more items, we directly create an unordered_set
      offsetSet = std::make_unique<std::unordered_set<ValueLength>>();
    }
  }
  ValueLength actualNrItems = 0;
  uint8_t const* member = firstMember;
  while (member < indexTable) {
    validatePart(member, indexTable - member, true);

    Slice key(member);
    bool const isString = key.isString();
    if (!isString) {
      bool const isSmallInt = key.isSmallInt();
      if ((!isSmallInt && !key.isUInt()) ||
          (isSmallInt && key.getSmallInt() <= 0)) {
        throw Exception(Exception::ValidatorInvalidLength,
                        "Invalid object key type");
      }
    }

    ValueLength const keySize = key.byteSize();
    if (isString && options->validateUtf8Strings) {
      validatePart(member, keySize, true);
    }

    uint8_t const* value = member + keySize;
    if (value >= indexTable) {
      throw Exception(Exception::ValidatorInvalidLength,
                      "Object value leaking into index table");
    }
    validatePart(value, indexTable - value, true);

    ValueLength offset = static_cast<ValueLength>(member - ptr);
    if (nrItems <= 128) {
      table[actualNrItems] = offset;
    } else {
      offsetSet->emplace(offset);
    }

    member += keySize + Slice(value).byteSize();
    ++actualNrItems;

    if (actualNrItems > nrItems) {
      throw Exception(Exception::ValidatorInvalidLength,
                      "Object value has more key/value pairs than announced");
    }
  }

  if (actualNrItems < nrItems) {
    throw Exception(Exception::ValidatorInvalidLength,
                    "Object has fewer items than in index");
  }

  // Finally verify each offset in the index:
  if (nrItems <= 128) {
    for (ValueLength pos = 0; pos < nrItems; ++pos) {
      ValueLength offset = readIntegerNonEmpty<ValueLength>(
          indexTable + pos * byteSizeLength, byteSizeLength);
      // Binary search in sorted index list:
      ValueLength low = 0;
      ValueLength high = nrItems;
      bool found = false;
      while (low < high) {
        ValueLength mid = (low + high) / 2;
        if (offset == table[mid]) {
          found = true;
          break;
        } else if (offset < table[mid]) {
          high = mid;
        } else {  // offset > table[mid]
          low = mid + 1;
        }
      }
      if (!found) {
        throw Exception(Exception::ValidatorInvalidLength,
                        "Object has invalid index offset");
      }
    }
  } else {
    for (ValueLength pos = 0; pos < nrItems; ++pos) {
      ValueLength offset = readIntegerNonEmpty<ValueLength>(
          indexTable + pos * byteSizeLength, byteSizeLength);
      auto i = offsetSet->find(offset);
      if (i == offsetSet->end()) {
        throw Exception(Exception::ValidatorInvalidLength,
                        "Object has invalid index offset");
      }
      offsetSet->erase(i);
    }
  }
}